

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arxmlStorage.cpp
# Opt level: O1

void __thiscall lsp::ArxmlStorage::ArxmlStorage(ArxmlStorage *this)

{
  type *ptVar1;
  ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>
  *poVar2;
  ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>_>
  *poVar3;
  
  poVar3 = (ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>_>
            *)operator_new(0xb0);
  (this->shortnames_).super_header_holder<_f24f1bd6_>.member = poVar3;
  poVar2 = &(poVar3->
            super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>
            ).
            super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>
  ;
  (poVar3->
  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>
  ).
  super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>
  .
  super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .
  super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .super_type.parentcolor_ = 0;
  (poVar3->
  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>
  ).
  super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>
  .
  super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .
  super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .super_type.left_ =
       &poVar2->
        super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  ;
  (poVar3->
  super_ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>
  ).
  super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>
  .
  super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .
  super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .super_type.right_ =
       &poVar2->
        super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  ;
  (poVar3->
  super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>_>
  ).
  super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .
  super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .super_type.parentcolor_ = 0;
  (poVar3->
  super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>_>
  ).
  super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .
  super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .super_type.left_ =
       &(poVar3->
        super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>_>
        ).
        super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  ;
  (poVar3->
  super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>_>
  ).
  super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .
  super_ordered_index_node_impl_base<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  .super_type.right_ =
       &(poVar3->
        super_ordered_index_node_trampoline<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<lsp::ShortnameElement,_std::allocator<lsp::ShortnameElement>_>_>_>
        ).
        super_ordered_index_node_impl<boost::multi_index::detail::null_augment_policy,_std::allocator<char>_>
  ;
  (this->shortnames_).node_count = 0;
  ptVar1 = &(this->shortnames_).super_type;
  this->shortnamesFullPathIndex_ = ptVar1;
  this->shortnamesOffsetIndex_ = (type *)ptVar1;
  (this->references_).
  super__Deque_base<lsp::ReferenceElement,_std::allocator<lsp::ReferenceElement>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->references_).
  super__Deque_base<lsp::ReferenceElement,_std::allocator<lsp::ReferenceElement>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->references_).
  super__Deque_base<lsp::ReferenceElement,_std::allocator<lsp::ReferenceElement>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->references_).
  super__Deque_base<lsp::ReferenceElement,_std::allocator<lsp::ReferenceElement>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->references_).
  super__Deque_base<lsp::ReferenceElement,_std::allocator<lsp::ReferenceElement>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->references_).
  super__Deque_base<lsp::ReferenceElement,_std::allocator<lsp::ReferenceElement>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->references_).
  super__Deque_base<lsp::ReferenceElement,_std::allocator<lsp::ReferenceElement>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->references_).
  super__Deque_base<lsp::ReferenceElement,_std::allocator<lsp::ReferenceElement>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->references_).
  super__Deque_base<lsp::ReferenceElement,_std::allocator<lsp::ReferenceElement>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->references_).
  super__Deque_base<lsp::ReferenceElement,_std::allocator<lsp::ReferenceElement>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  std::_Deque_base<lsp::ReferenceElement,_std::allocator<lsp::ReferenceElement>_>::_M_initialize_map
            (&(this->references_).
              super__Deque_base<lsp::ReferenceElement,_std::allocator<lsp::ReferenceElement>_>,0);
  (this->URIs_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->URIs_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->newlineOffsets_).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->URIs_).
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->newlineOffsets_).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->newlineOffsets_).
  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

lsp::ArxmlStorage::ArxmlStorage()
    : shortnames_(),
      shortnamesFullPathIndex_{shortnames_.get<tag_fullPathIndex>()},
      shortnamesOffsetIndex_{shortnames_.get<tag_offsetIndex>()}
    {}